

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UBool __thiscall icu_63::UnicodeSet::contains(UnicodeSet *this,UChar32 c)

{
  BMPSet *pBVar1;
  byte bVar2;
  int iVar3;
  int32_t iVar4;
  undefined8 in_RDX;
  
  while( true ) {
    pBVar1 = this->bmpSet;
    if (pBVar1 != (BMPSet *)0x0) {
      iVar3 = (*pBVar1->_vptr_BMPSet[2])(pBVar1,c,in_RDX,pBVar1->_vptr_BMPSet[2]);
      return (UBool)iVar3;
    }
    if (this->stringSpan == (UnicodeSetStringSpan *)0x0) break;
    this = &this->stringSpan->spanSet;
  }
  if (c < 0x110000) {
    iVar4 = findCodePoint(this,c);
    bVar2 = (byte)iVar4 & 1;
  }
  else {
    bVar2 = 0;
  }
  return bVar2;
}

Assistant:

UBool UnicodeSet::contains(UChar32 c) const {
    // Set i to the index of the start item greater than ch
    // We know we will terminate without length test!
    // LATER: for large sets, add binary search
    //int32_t i = -1;
    //for (;;) {
    //    if (c < list[++i]) break;
    //}
    if (bmpSet != NULL) {
        return bmpSet->contains(c);
    }
    if (stringSpan != NULL) {
        return stringSpan->contains(c);
    }
    if (c >= UNICODESET_HIGH) { // Don't need to check LOW bound
        return FALSE;
    }
    int32_t i = findCodePoint(c);
    return (UBool)(i & 1); // return true if odd
}